

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzma_LzmaEnc.cpp
# Opt level: O3

UInt32 crnlib::ReadMatchDistances(CLzmaEnc *p,UInt32 *numDistancePairsRes)

{
  UInt32 UVar1;
  Byte *pBVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  ulong uVar6;
  
  UVar1 = (*(p->matchFinder).GetNumAvailableBytes)(p->matchFinderObj);
  p->numAvail = UVar1;
  UVar1 = (*(p->matchFinder).GetMatches)(p->matchFinderObj,p->matches);
  if (UVar1 == 0) {
    uVar5 = 0;
  }
  else {
    uVar5 = p->matches[UVar1 - 2];
    uVar6 = (ulong)uVar5;
    if (uVar5 == p->numFastBytes) {
      pBVar2 = (*(p->matchFinder).GetPointerToCurrentPos)(p->matchFinderObj);
      uVar3 = 0x111;
      if (p->numAvail < 0x111) {
        uVar3 = p->numAvail;
      }
      if (uVar5 < uVar3) {
        pBVar2 = pBVar2 + (uVar6 - 1);
        do {
          uVar5 = (uint)uVar6;
          if (*pBVar2 != pBVar2[-(ulong)(p->matches[UVar1 - 1] + 1)]) break;
          uVar4 = (uint)uVar6 + 1;
          uVar6 = (ulong)uVar4;
          pBVar2 = pBVar2 + 1;
          uVar5 = uVar3;
        } while (uVar3 != uVar4);
      }
    }
  }
  p->additionalOffset = p->additionalOffset + 1;
  *numDistancePairsRes = UVar1;
  return uVar5;
}

Assistant:

static UInt32 ReadMatchDistances(CLzmaEnc* p, UInt32* numDistancePairsRes) {
  UInt32 lenRes = 0, numPairs;
  p->numAvail = p->matchFinder.GetNumAvailableBytes(p->matchFinderObj);
  numPairs = p->matchFinder.GetMatches(p->matchFinderObj, p->matches);
#ifdef SHOW_STAT
  printf("\n i = %d numPairs = %d    ", ttt, numPairs / 2);
  ttt++;
  {
    UInt32 i;
    for (i = 0; i < numPairs; i += 2)
      printf("%2d %6d   | ", p->matches[i], p->matches[i + 1]);
  }
#endif
  if (numPairs > 0) {
    lenRes = p->matches[numPairs - 2];
    if (lenRes == p->numFastBytes) {
      const Byte* pby = p->matchFinder.GetPointerToCurrentPos(p->matchFinderObj) - 1;
      UInt32 distance = p->matches[numPairs - 1] + 1;
      UInt32 numAvail = p->numAvail;
      if (numAvail > LZMA_MATCH_LEN_MAX)
        numAvail = LZMA_MATCH_LEN_MAX;
      {
        const Byte* pby2 = pby - distance;
        for (; lenRes < numAvail && pby[lenRes] == pby2[lenRes]; lenRes++)
          ;
      }
    }
  }
  p->additionalOffset++;
  *numDistancePairsRes = numPairs;
  return lenRes;
}